

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int find_profile_id(char *profile)

{
  int iVar1;
  char *name_1;
  char *name;
  size_t i;
  char *profile_local;
  
  name = (char *)0x0;
  do {
    i = (size_t)profile;
    if ((char *)0x4 < name) {
LAB_0010d092:
      name = (char *)0x0;
      while( true ) {
        if ((char *)0x4 < name) {
          return -1;
        }
        iVar1 = strcmp(profiles[(long)name].name,(char *)i);
        if (iVar1 == 0) break;
        name = name + 1;
      }
      return (int)name;
    }
    iVar1 = strcmp(profileMap[(long)name].from,profile);
    if (iVar1 == 0) {
      i = (size_t)profileMap[(long)name].to;
      goto LAB_0010d092;
    }
    name = name + 1;
  } while( true );
}

Assistant:

static int find_profile_id(const char *profile)
{
    size_t i;
    for (i = 0; i < STATICARRAYLEN(profileMap); i++)
    {
        const char *name = profileMap[i].from;
        if (strcmp(name, profile) == 0)
        {
            profile = profileMap[i].to;
            break;
        } // if
    } // for

    for (i = 0; i < STATICARRAYLEN(profiles); i++)
    {
        const char *name = profiles[i].name;
        if (strcmp(name, profile) == 0)
            return i;
    } // for

    return -1;  // no match.
}